

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

StrongWeakPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StrongWeakPropertyExprSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SequenceExprSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,SequenceExprSyntax *args_2,Token *args_3)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  StrongWeakPropertyExprSyntax *pSVar16;
  
  pSVar16 = (StrongWeakPropertyExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((StrongWeakPropertyExprSyntax *)this->endPtr < pSVar16 + 1) {
    pSVar16 = (StrongWeakPropertyExprSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pSVar16 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar1 = args->info;
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar12 = args_3->kind;
  uVar13 = args_3->field_0x2;
  NVar14.raw = (args_3->numFlags).raw;
  uVar15 = args_3->rawLen;
  pIVar3 = args_3->info;
  (pSVar16->super_PropertyExprSyntax).super_SyntaxNode.kind = StrongWeakPropertyExpr;
  (pSVar16->super_PropertyExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pSVar16->super_PropertyExprSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pSVar16->keyword).kind = TVar4;
  (pSVar16->keyword).field_0x2 = uVar5;
  (pSVar16->keyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pSVar16->keyword).rawLen = uVar7;
  (pSVar16->keyword).info = pIVar1;
  (pSVar16->openParen).kind = TVar8;
  (pSVar16->openParen).field_0x2 = uVar9;
  (pSVar16->openParen).numFlags = (NumericTokenFlags)NVar10.raw;
  (pSVar16->openParen).rawLen = uVar11;
  (pSVar16->openParen).info = pIVar2;
  (pSVar16->expr).ptr = args_2;
  (pSVar16->closeParen).kind = TVar12;
  (pSVar16->closeParen).field_0x2 = uVar13;
  (pSVar16->closeParen).numFlags = (NumericTokenFlags)NVar14.raw;
  (pSVar16->closeParen).rawLen = uVar15;
  (pSVar16->closeParen).info = pIVar3;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pSVar16;
  return pSVar16;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }